

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

void __thiscall
booster::aio::stream_socket::async_read(stream_socket *this,mutable_buffer *buffer,io_handler *h)

{
  mutable_buffer *this_00;
  stream_socket *this_01;
  bool bVar1;
  reader_all *this_02;
  size_t n;
  io_service *this_03;
  atomic_counter *this_04;
  intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> local_50;
  callback<void_(const_std::error_code_&)> local_48;
  pointer r;
  error_code e;
  
  bVar1 = basic_io_device::dont_block((basic_io_device *)this,h);
  if (bVar1) {
    this_02 = (reader_all *)operator_new(0x58);
    callable<void_(const_std::error_code_&)>::callable
              ((callable<void_(const_std::error_code_&)> *)this_02);
    (this_02->super_callable<void_(const_std::error_code_&)>).super_refcounted._vptr_refcounted =
         (_func_int **)&PTR__reader_all_001d9160;
    this_00 = &this_02->buf;
    buffer_impl<char_*>::buffer_impl
              (&this_00->super_buffer_impl<char_*>,&buffer->super_buffer_impl<char_*>);
    this_02->count = 0;
    this_02->self = this;
    intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::intrusive_ptr
              (&(this_02->h).call_ptr,&h->call_ptr);
    this_04 = &(this_02->super_callable<void_(const_std::error_code_&)>).super_refcounted.refs_;
    r.p_ = this_02;
    atomic_counter::inc(this_04);
    e._M_value = 0;
    e._M_cat = (error_category *)std::_V2::system_category();
    n = read_some(this_02->self,this_00,&e);
    this_02->count = this_02->count + n;
    operator+=(this_00,n);
    if (((this_00->super_buffer_impl<char_*>).size_ == 0) ||
       ((e._M_value != 0 && (bVar1 = basic_io_device::would_block(&e), !bVar1)))) {
      this_03 = basic_io_device::get_io_service((basic_io_device *)this_02->self);
      io_service::post(this_03,&this_02->h,&e,this_02->count);
    }
    else {
      this_01 = this_02->self;
      local_50.p_ = this_02;
      atomic_counter::inc(this_04);
      callback<void_(const_std::error_code_&)>::
      callback<booster::aio::(anonymous_namespace)::reader_all>(&local_48,&local_50);
      basic_io_device::on_readable((basic_io_device *)this_01,&local_48);
      intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                (&local_48.call_ptr);
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all>::~intrusive_ptr(&local_50);
    }
    intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all>::~intrusive_ptr(&r);
    return;
  }
  return;
}

Assistant:

void stream_socket::async_read(mutable_buffer const &buffer,io_handler const &h)
{
	if(!dont_block(h))
		return;
	reader_all::pointer r(new reader_all(this,buffer,h));
	r->run();
}